

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

void __thiscall
amrex::BaseFab<unsigned_int>::BaseFab(BaseFab<unsigned_int> *this,BaseFab<unsigned_int> *rhs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Arena *pAVar4;
  
  pAVar4 = DataAllocator::arena(&rhs->super_DataAllocator);
  (this->super_DataAllocator).m_arena = pAVar4;
  this->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_007d3008;
  this->dptr = rhs->dptr;
  uVar1 = *(undefined8 *)(rhs->domain).smallend.vect;
  uVar2 = *(undefined8 *)((rhs->domain).smallend.vect + 2);
  uVar3 = *(undefined8 *)((rhs->domain).bigend.vect + 2);
  *(undefined8 *)(this->domain).bigend.vect = *(undefined8 *)(rhs->domain).bigend.vect;
  *(undefined8 *)((this->domain).bigend.vect + 2) = uVar3;
  *(undefined8 *)(this->domain).smallend.vect = uVar1;
  *(undefined8 *)((this->domain).smallend.vect + 2) = uVar2;
  this->nvar = rhs->nvar;
  this->truesize = rhs->truesize;
  this->ptr_owner = rhs->ptr_owner;
  this->shared_memory = rhs->shared_memory;
  rhs->dptr = (uint *)0x0;
  rhs->ptr_owner = false;
  return;
}

Assistant:

BaseFab<T>::BaseFab (BaseFab<T>&& rhs) noexcept
    : DataAllocator{rhs.arena()},
      dptr(rhs.dptr), domain(rhs.domain),
      nvar(rhs.nvar), truesize(rhs.truesize),
      ptr_owner(rhs.ptr_owner), shared_memory(rhs.shared_memory)
{
    rhs.dptr = nullptr;
    rhs.ptr_owner = false;
}